

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pqmf.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  ostringstream *this;
  int iVar6;
  char *pcVar7;
  int iVar8;
  allocator local_479;
  int num_subband;
  int num_filter_order;
  uint local_470;
  int num_iteration;
  string local_468;
  double initial_step_size;
  double convergence_threshold;
  double attenuation;
  double input;
  PseudoQuadratureMirrorFilterBanks analysis;
  vector<double,_std::allocator<double>_> output;
  Buffer buffer;
  ostringstream error_message_8;
  ifstream ifs;
  byte abStack_218 [488];
  
  num_subband = 4;
  num_filter_order = 0x2f;
  attenuation = 100.0;
  num_iteration = 100;
  convergence_threshold = 1e-06;
  initial_step_size = 0.01;
  local_470 = 0x47ae1401;
LAB_001036fe:
  do {
    iVar4 = ya_getopt_long(argc,argv,"k:m:a:i:d:s:rh",(option *)0x0,(int *)0x0);
    switch(iVar4) {
    case 0x61:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
      bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&attenuation);
      bVar2 = attenuation <= 0.0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -a option must be a positive number");
        std::__cxx11::string::string((string *)&error_message_8,"pqmf",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
        goto LAB_00103b6d;
      }
      break;
    case 100:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
      bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&convergence_threshold);
      bVar2 = convergence_threshold < 0.0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,
                        "The argument for the -d option must be a non-negative number");
        std::__cxx11::string::string((string *)&error_message_8,"pqmf",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
        goto LAB_00103b6d;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_3747::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_iteration);
      bVar2 = num_iteration < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -i option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_8,"pqmf",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
        goto LAB_00103b6d;
      }
      break;
    case 0x6b:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_subband);
      bVar2 = num_subband < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -k option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_8,"pqmf",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
        goto LAB_00103b6d;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_filter_order);
      bVar2 = num_filter_order < 2;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -m option must be greater than 1");
        std::__cxx11::string::string((string *)&error_message_8,"pqmf",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
        goto LAB_00103b6d;
      }
      break;
    case 0x72:
      local_470 = 0;
      break;
    case 0x73:
      goto switchD_00103727_caseD_73;
    default:
      if (iVar4 == -1) {
        if (1 < argc - ya_optind) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"Too many input files");
          std::__cxx11::string::string((string *)&error_message_8,"pqmf",(allocator *)&analysis);
          sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
          goto LAB_00103b6d;
        }
        if (argc == ya_optind) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = argv[ya_optind];
        }
        bVar2 = sptk::SetBinaryMode();
        this = (ostringstream *)&ifs;
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream(this);
          std::operator<<((ostream *)this,"Cannot set translation mode");
          std::__cxx11::string::string((string *)&error_message_8,"pqmf",(allocator *)&analysis);
          sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
          goto LAB_00103b6d;
        }
        std::ifstream::ifstream(this);
        if ((pcVar7 != (char *)0x0) &&
           (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar7),
           (abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
          poVar5 = std::operator<<((ostream *)&error_message_8,"Cannot open file ");
          std::operator<<(poVar5,pcVar7);
          std::__cxx11::string::string((string *)&analysis,"pqmf",(allocator *)&buffer);
          sptk::PrintErrorMessage((string *)&analysis,&error_message_8);
          std::__cxx11::string::~string((string *)&analysis);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_8);
          iVar4 = 1;
          goto LAB_00103fde;
        }
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          this = (ostringstream *)&std::cin;
        }
        sptk::PseudoQuadratureMirrorFilterBanks::PseudoQuadratureMirrorFilterBanks
                  (&analysis,num_subband,num_filter_order,attenuation,num_iteration,
                   convergence_threshold,initial_step_size);
        buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00114b50;
        buffer.buffer_for_all_zero_filter_.
        super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        buffer.buffer_for_all_zero_filter_.
        super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        buffer.buffer_for_all_zero_filter_.
        super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (analysis.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
          std::operator<<((ostream *)&error_message_8,
                          "Failed to initialize PseudoQuadratureMirrorFilterBanks");
          std::__cxx11::string::string((string *)&local_468,"pqmf",(allocator *)&output);
          sptk::PrintErrorMessage(&local_468,&error_message_8);
          std::__cxx11::string::~string((string *)&local_468);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_8);
          iVar4 = 1;
          goto LAB_00103fc7;
        }
        std::vector<double,_std::allocator<double>_>::vector
                  (&output,(long)num_subband,(allocator_type *)&error_message_8);
        bVar2 = sptk::IsEven(num_filter_order);
        iVar6 = (int)(num_filter_order - (uint)!bVar2) / 2;
        iVar8 = 0;
        goto LAB_00103d7e;
      }
    case 0x62:
    case 99:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
      anon_unknown.dwarf_3747::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
  } while( true );
  while( true ) {
    bVar2 = sptk::PseudoQuadratureMirrorFilterBanks::Run(&analysis,input,&output,&buffer);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
      std::operator<<((ostream *)&error_message_8,"Failed to perform PQMF analysis");
      std::__cxx11::string::string((string *)&local_468,"pqmf",&local_479);
      sptk::PrintErrorMessage(&local_468,&error_message_8);
      goto LAB_00103fa0;
    }
    if ((((local_470 & 1) == 0) || (iVar4 = iVar8 + 1, bVar2 = iVar6 <= iVar8, iVar8 = iVar4, bVar2)
        ) && (bVar2 = sptk::WriteStream<double>
                                (0,num_subband,&output,(ostream *)&std::cout,(int *)0x0), !bVar2))
    break;
LAB_00103d7e:
    bVar2 = sptk::ReadStream<double>(&input,(istream *)this);
    if (!bVar2) {
      iVar4 = 0;
      if ((local_470 & 1) == 0) goto LAB_00103fba;
      if (iVar8 < iVar6) {
        iVar6 = iVar8;
      }
      iVar4 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      iVar6 = iVar6 + 1;
      goto LAB_00103ed0;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
  std::operator<<((ostream *)&error_message_8,"Failed to write subband signals");
  std::__cxx11::string::string((string *)&local_468,"pqmf",&local_479);
  sptk::PrintErrorMessage(&local_468,&error_message_8);
  goto LAB_00103fa0;
switchD_00103727_caseD_73:
  std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
  bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&initial_step_size);
  bVar2 = initial_step_size <= 0.0;
  std::__cxx11::string::~string((string *)&ifs);
  if (!bVar1 || bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"The argument for the -s option must be a positive number");
    std::__cxx11::string::string((string *)&error_message_8,"pqmf",(allocator *)&analysis);
    sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
LAB_00103b6d:
    std::__cxx11::string::~string((string *)&error_message_8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    return 1;
  }
  goto LAB_001036fe;
  while( true ) {
    bVar2 = sptk::PseudoQuadratureMirrorFilterBanks::Run(&analysis,input,&output,&buffer);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
      std::operator<<((ostream *)&error_message_8,"Failed to perform PQMF analysis");
      std::__cxx11::string::string((string *)&local_468,"pqmf",&local_479);
      sptk::PrintErrorMessage(&local_468,&error_message_8);
      goto LAB_00103fa0;
    }
    bVar2 = sptk::WriteStream<double>(0,num_subband,&output,(ostream *)&std::cout,(int *)0x0);
    if (!bVar2) break;
LAB_00103ed0:
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) goto LAB_00103fba;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
  std::operator<<((ostream *)&error_message_8,"Failed to write subband signals");
  std::__cxx11::string::string((string *)&local_468,"pqmf",&local_479);
  sptk::PrintErrorMessage(&local_468,&error_message_8);
LAB_00103fa0:
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_8);
  iVar4 = 1;
LAB_00103fba:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
LAB_00103fc7:
  sptk::PseudoQuadratureMirrorFilterBanks::Buffer::~Buffer(&buffer);
  sptk::PseudoQuadratureMirrorFilterBanks::~PseudoQuadratureMirrorFilterBanks(&analysis);
LAB_00103fde:
  std::ifstream::~ifstream(&ifs);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_subband(kDefaultNumSubband);
  int num_filter_order(kDefaultNumFilterOrder);
  double attenuation(kDefaultAttenuation);
  int num_iteration(kDefaultNumIteration);
  double convergence_threshold(kDefaultConvergenceThreshold);
  double initial_step_size(kDefaultInitialStepSize);
  bool delay_compensation(kDefaultDelayCompensation);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "k:m:a:i:d:s:rh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_subband) ||
            num_subband <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -k option must be a positive integer";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order <= 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -m option must be greater than 1";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &attenuation) ||
            attenuation <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be a positive number";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -i option must be a positive integer";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &convergence_threshold) ||
            convergence_threshold < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToDouble(optarg, &initial_step_size) ||
            initial_step_size <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -s option must be a positive number";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'r': {
        delay_compensation = false;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("pqmf", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("pqmf", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("pqmf", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::PseudoQuadratureMirrorFilterBanks analysis(
      num_subband, num_filter_order, attenuation, num_iteration,
      convergence_threshold, initial_step_size);
  sptk::PseudoQuadratureMirrorFilterBanks::Buffer buffer;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize PseudoQuadratureMirrorFilterBanks";
    sptk::PrintErrorMessage("pqmf", error_message);
    return 1;
  }

  double input;
  std::vector<double> output(num_subband);
  const int delay(sptk::IsEven(num_filter_order) ? num_filter_order / 2
                                                 : (num_filter_order - 1) / 2);

  int num_read(0);
  while (sptk::ReadStream(&input, &input_stream)) {
    if (!analysis.Run(input, &output, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to perform PQMF analysis";
      sptk::PrintErrorMessage("pqmf", error_message);
      return 1;
    }
    if (!delay_compensation || delay <= num_read++) {
      if (!sptk::WriteStream(0, num_subband, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write subband signals";
        sptk::PrintErrorMessage("pqmf", error_message);
        return 1;
      }
    }
  }

  if (delay_compensation) {
    const int n(std::min(delay, num_read));
    for (int i(0); i < n; ++i) {
      if (!analysis.Run(input, &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to perform PQMF analysis";
        sptk::PrintErrorMessage("pqmf", error_message);
        return 1;
      }
      if (!sptk::WriteStream(0, num_subband, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write subband signals";
        sptk::PrintErrorMessage("pqmf", error_message);
        return 1;
      }
    }
  }

  return 0;
}